

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb)

{
  int iVar1;
  int local_28;
  int local_24;
  int acc;
  int j;
  vorbis_info_residue0 *info;
  oggpack_buffer *opb_local;
  vorbis_info_residue *vr_local;
  
  local_28 = 0;
  oggpack_write(opb,*vr,0x18);
  oggpack_write(opb,*(unsigned_long *)((long)vr + 8),0x18);
  oggpack_write(opb,(long)(*(int *)((long)vr + 0x10) + -1),0x18);
  oggpack_write(opb,(long)(*(int *)((long)vr + 0x14) + -1),6);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x1c),8);
  for (local_24 = 0; local_24 < *(int *)((long)vr + 0x14); local_24 = local_24 + 1) {
    iVar1 = ov_ilog(*(ogg_uint32_t *)((long)vr + (long)local_24 * 4 + 0x20));
    if (iVar1 < 4) {
      oggpack_write(opb,(long)*(int *)((long)vr + (long)local_24 * 4 + 0x20),4);
    }
    else {
      oggpack_write(opb,(long)*(int *)((long)vr + (long)local_24 * 4 + 0x20),3);
      oggpack_write(opb,1,1);
      oggpack_write(opb,(long)(*(int *)((long)vr + (long)local_24 * 4 + 0x20) >> 3),5);
    }
    iVar1 = icount(*(uint *)((long)vr + (long)local_24 * 4 + 0x20));
    local_28 = iVar1 + local_28;
  }
  for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
    oggpack_write(opb,(long)*(int *)((long)vr + (long)local_24 * 4 + 0x120),8);
  }
  return;
}

Assistant:

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  int j,acc=0;
  oggpack_write(opb,info->begin,24);
  oggpack_write(opb,info->end,24);

  oggpack_write(opb,info->grouping-1,24);  /* residue vectors to group and
                                             code with a partitioned book */
  oggpack_write(opb,info->partitions-1,6); /* possible partition choices */
  oggpack_write(opb,info->groupbook,8);  /* group huffman book */

  /* secondstages is a bitmask; as encoding progresses pass by pass, a
     bitmask of one indicates this partition class has bits to write
     this pass */
  for(j=0;j<info->partitions;j++){
    if(ov_ilog(info->secondstages[j])>3){
      /* yes, this is a minor hack due to not thinking ahead */
      oggpack_write(opb,info->secondstages[j],3);
      oggpack_write(opb,1,1);
      oggpack_write(opb,info->secondstages[j]>>3,5);
    }else
      oggpack_write(opb,info->secondstages[j],4); /* trailing zero */
    acc+=icount(info->secondstages[j]);
  }
  for(j=0;j<acc;j++)
    oggpack_write(opb,info->booklist[j],8);

}